

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GpuCounterConfig::Serialize(GpuCounterConfig *this,Message *msg)

{
  bool bVar1;
  reference puVar2;
  void *data;
  size_t size;
  uint *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Message *msg_local;
  GpuCounterConfig *this_local;
  
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,1,this->counter_period_ns_);
  }
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->counter_ids_);
  it = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->counter_ids_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&it), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    protozero::Message::AppendVarInt<unsigned_int>(msg,2,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)(this->instrumented_sampling_ & 1));
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)(this->fix_gpu_clock_ & 1));
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void GpuCounterConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: counter_period_ns
  if (_has_field_[1]) {
    msg->AppendVarInt(1, counter_period_ns_);
  }

  // Field 2: counter_ids
  for (auto& it : counter_ids_) {
    msg->AppendVarInt(2, it);
  }

  // Field 3: instrumented_sampling
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, instrumented_sampling_);
  }

  // Field 4: fix_gpu_clock
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, fix_gpu_clock_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}